

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEObserver.cpp
# Opt level: O0

void __thiscall CEObserver::UpdatePosVel(CEObserver *this,CEDate *date)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  reference pvVar4;
  long *in_RSI;
  long in_RDI;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int i;
  double mps_apd;
  double ehpv [2] [3];
  double ebpv [2] [3];
  double pvc [2] [3];
  double sp;
  double theta;
  double tt2;
  double tt1;
  double tdb2;
  double tdb1;
  double ut12;
  double ut11;
  double *in_stack_fffffffffffffe88;
  double *in_stack_fffffffffffffe90;
  double *in_stack_fffffffffffffe98;
  double *in_stack_fffffffffffffea0;
  int local_104;
  undefined1 local_f8 [48];
  double local_c8 [6];
  double local_98 [6];
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  long *local_10;
  
  local_10 = in_RSI;
  dVar5 = (double)(**(code **)(*in_RSI + 0x28))();
  if ((dVar5 != *(double *)(in_RDI + 0x40)) || (NAN(dVar5) || NAN(*(double *)(in_RDI + 0x40)))) {
    local_18 = 0;
    local_20 = 0;
    local_28 = 0;
    local_30 = 0;
    local_38 = 0;
    local_40 = 0;
    local_48 = (**(code **)(*local_10 + 0x28))();
    CEDate::UTC2UT1(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    local_50 = (**(code **)(*local_10 + 0x28))();
    CEDate::UTC2TDB(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,(double *)0x139e45);
    local_58 = (**(code **)(*local_10 + 0x28))();
    CEDate::UTC2TT(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    local_60 = iauEra00(local_18,local_20);
    local_68 = iauSp00(local_38,local_40);
    uVar1 = *(undefined8 *)(in_RDI + 8);
    uVar2 = *(undefined8 *)(in_RDI + 0x10);
    uVar3 = *(undefined8 *)(in_RDI + 0x18);
    dVar5 = CEDate::xpolar((CEDate *)0x139eec);
    dVar6 = CEDate::ypolar((CEDate *)0x139eff);
    iauPvtob(uVar1,uVar2,uVar3,dVar5,SUB84(dVar6,0),local_68,local_60,local_c8 + 6);
    iauEpv00(local_28,local_30,local_f8,local_c8);
    dVar5 = CppEphem::sec_per_day();
    dVar6 = CppEphem::m_per_au();
    for (local_104 = 0; local_104 < 3; local_104 = local_104 + 1) {
      dVar8 = local_c8[(long)local_104 + 6];
      dVar7 = CppEphem::m_per_au();
      dVar8 = dVar8 / dVar7;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),(long)local_104
                         );
      *pvVar4 = dVar8;
      dVar8 = local_c8[(long)local_104 + 9] * (dVar5 / dVar6);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x78),(long)local_104
                         );
      *pvVar4 = dVar8;
      dVar8 = local_c8[local_104];
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x48),(long)local_104
                         );
      dVar7 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x60),(long)local_104
                         );
      *pvVar4 = dVar8 + dVar7;
      dVar8 = local_c8[(long)local_104 + 3];
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x78),(long)local_104
                         );
      dVar7 = *pvVar4;
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x90),(long)local_104
                         );
      *pvVar4 = dVar8 + dVar7;
    }
  }
  return;
}

Assistant:

void CEObserver::UpdatePosVel(const CEDate& date) const
{
    // Check if the cached date has changed
    if (date.MJD() != cache_date_) {

        // Convert UTC to UT1 and TDB
        double ut11(0.0);
        double ut12(0.0);
        double tdb1(0.0);
        double tdb2(0.0);
        double tt1(0.0);
        double tt2(0.0);
        CEDate::UTC2UT1(date.MJD(), &ut11, &ut12);
        CEDate::UTC2TDB(date.MJD(), &tdb1, &tdb2);
        CEDate::UTC2TT(date.MJD(), &tt1, &tt2);

        // Compute the Earth rotation angle at UT1
        double theta = iauEra00(ut11, ut12);
        double sp    = iauSp00(tt1, tt2);

        // Vectors for intermediate position/velocities
        double pvc[2][3];   // CIRS pos,vel

        // Get the position and velocity values in CIRS
        iauPvtob(longitude_, 
                 latitude_, 
                 elevation_m_, 
                 date.xpolar(),
                 date.ypolar(),
                 sp,
                 theta,
                 pvc);

        // Earth centric distance/velocity in ICRS (AU and AU/day)
        double ebpv[2][3];
        double ehpv[2][3];
        iauEpv00(tdb1, tdb2, ehpv, ebpv);

        // Get the CIRS and ICRS pos,vel
        double mps_apd = CppEphem::sec_per_day() / CppEphem::m_per_au();
        for (int i=0; i<3; i++) {
            // CIRS
            pos_cirs_[i] = pvc[0][i] / CppEphem::m_per_au();
            vel_cirs_[i] = pvc[1][i] * mps_apd;

            // ICRS (Earth barycenter + CIRS offset)
            pos_icrs_[i] = ebpv[0][i] + pos_cirs_[i];
            vel_icrs_[i] = ebpv[1][i] + vel_cirs_[i];
        }
    }
    return;
}